

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int lre_is_cased(uint32_t c)

{
  uint uVar1;
  BOOL BVar2;
  uint in_EDI;
  uint32_t unaff_retaddr;
  int idx_max;
  int idx_min;
  int idx;
  uint32_t len;
  uint32_t code;
  uint32_t v;
  int local_20;
  int local_1c;
  uint in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffffc;
  
  local_1c = 0;
  local_20 = 0x168;
  while( true ) {
    while( true ) {
      if (local_20 < local_1c) {
        BVar2 = lre_is_in_table(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                                (uint8_t *)
                                CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                                in_stack_ffffffffffffffec);
        return BVar2;
      }
      uVar1 = (uint)(local_20 + local_1c) >> 1;
      in_stack_fffffffffffffff4 = case_conv_table1[(int)uVar1];
      in_stack_fffffffffffffff0 = in_stack_fffffffffffffff4 >> 0xf;
      in_stack_ffffffffffffffec = in_stack_fffffffffffffff4 >> 8 & 0x7f;
      if (in_stack_fffffffffffffff0 <= in_EDI) break;
      local_20 = uVar1 - 1;
    }
    if (in_EDI < in_stack_fffffffffffffff0 + in_stack_ffffffffffffffec) break;
    local_1c = uVar1 + 1;
  }
  return 1;
}

Assistant:

BOOL lre_is_cased(uint32_t c)
{
    uint32_t v, code, len;
    int idx, idx_min, idx_max;
        
    idx_min = 0;
    idx_max = countof(case_conv_table1) - 1;
    while (idx_min <= idx_max) {
        idx = (unsigned)(idx_max + idx_min) / 2;
        v = case_conv_table1[idx];
        code = v >> (32 - 17);
        len = (v >> (32 - 17 - 7)) & 0x7f;
        if (c < code) {
            idx_max = idx - 1;
        } else if (c >= code + len) {
            idx_min = idx + 1;
        } else {
            return TRUE;
        }
    }
    return lre_is_in_table(c, unicode_prop_Cased1_table,
                           unicode_prop_Cased1_index,
                           sizeof(unicode_prop_Cased1_index) / 3);
}